

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O3

FT_Pos af_hint_normal_stem(AF_GlyphHints hints,AF_Edge_conflict edge,AF_Edge_conflict edge2,
                          FT_Pos anchor,AF_Dimension dim)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  FT_Pos FVar4;
  long lVar5;
  uint uVar6;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar7;
  
  uVar1 = hints->other_flags;
  lVar10 = 0x40;
  if ((uVar1 & 4) == 0) {
    if (((edge->flags & 1) == 0) || ((edge2->flags & 1) == 0)) {
      lVar10 = (ulong)(dim == AF_DIMENSION_VERT) * 2 + 0x3b;
    }
    else {
      lVar10 = 0x31;
      if (dim == AF_DIMENSION_VERT) {
        lVar10 = 0x37;
      }
    }
  }
  lVar2 = edge2->opos;
  lVar3 = edge->opos;
  FVar4 = af_cjk_compute_stem_width
                    ((AF_GlyphHints)(ulong)uVar1,(AF_Dimension)hints->metrics,(ulong)dim,
                     (int)lVar2 - (int)lVar3,dim);
  uVar8 = ((lVar2 + lVar3) / 2 + anchor) - FVar4 / 2;
  uVar13 = (uint)uVar8 & 0x3f;
  uVar11 = 0;
  if ((uVar8 & 0x3f) == 0) {
LAB_0018244b:
    uVar7 = uVar11;
    if (((uVar1 & 4) != 0) || (uVar7 = 0xe, 0xe < (long)uVar11)) goto LAB_00182470;
  }
  else {
    uVar6 = (uint)uVar8 + (uint)FVar4 & 0x3f;
    uVar7 = (ulong)uVar6;
    if (uVar6 == 0) goto LAB_0018244b;
    uVar12 = 0x40 - (ulong)uVar13;
    if (FVar4 <= lVar10) {
      if ((long)uVar7 < FVar4) {
        uVar11 = -uVar7;
        if (uVar12 <= uVar7) {
          uVar11 = uVar12;
        }
      }
      else {
        uVar11 = 0;
      }
      goto LAB_0018244b;
    }
    if ((uVar1 & 4) != 0) {
LAB_001823cc:
      uVar13 = (uint)FVar4 & 0x3f;
      uVar14 = (ulong)uVar13;
      if (uVar14 < 0x20) {
        uVar11 = 0;
        if (((uint)uVar12 <= uVar13) || (uVar11 = 0, uVar6 <= uVar13)) goto LAB_0018244b;
      }
      else {
        uVar14 = 0x40 - lVar10;
      }
      uVar15 = -(lVar10 - uVar12);
      if ((long)(uVar12 - uVar14) < (long)(lVar10 - uVar12)) {
        uVar15 = uVar12 - uVar14;
      }
      uVar11 = -(uVar7 - uVar14);
      if ((long)(lVar10 - uVar7) < (long)(uVar7 - uVar14)) {
        uVar11 = lVar10 - uVar7;
      }
      uVar7 = -uVar15;
      if (0 < (long)uVar15) {
        uVar7 = uVar15;
      }
      uVar12 = -uVar11;
      if (0 < (long)uVar11) {
        uVar12 = uVar11;
      }
      if ((uint)uVar7 <= (uint)uVar12) {
        uVar11 = uVar15;
      }
      goto LAB_0018244b;
    }
    uVar11 = 0;
    uVar9 = (uint)lVar10;
    if ((((uVar13 < uVar9) && ((uint)uVar12 < uVar9)) && (uVar6 < uVar9)) &&
       (uVar11 = 0, 0x40 - uVar6 < uVar9)) goto LAB_001823cc;
  }
  uVar7 = 0xfffffffffffffff2;
  if (-0xe < (long)uVar11) {
    uVar7 = uVar11;
  }
LAB_00182470:
  lVar10 = uVar8 + uVar7;
  lVar5 = FVar4 + lVar10;
  if (lVar2 <= lVar3) {
    lVar5 = lVar10;
    lVar10 = FVar4 + lVar10;
  }
  edge->pos = lVar10;
  edge2->pos = lVar5;
  return uVar7;
}

Assistant:

static FT_Pos
  af_hint_normal_stem( AF_GlyphHints  hints,
                       AF_Edge        edge,
                       AF_Edge        edge2,
                       FT_Pos         anchor,
                       AF_Dimension   dim )
  {
    FT_Pos  org_len, cur_len, org_center;
    FT_Pos  cur_pos1, cur_pos2;
    FT_Pos  d_off1, u_off1, d_off2, u_off2, delta;
    FT_Pos  offset;
    FT_Pos  threshold = 64;


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) )
    {
      if ( ( edge->flags  & AF_EDGE_ROUND ) &&
           ( edge2->flags & AF_EDGE_ROUND ) )
      {
        if ( dim == AF_DIMENSION_VERT )
          threshold = 64 - AF_LIGHT_MODE_MAX_HORZ_GAP;
        else
          threshold = 64 - AF_LIGHT_MODE_MAX_VERT_GAP;
      }
      else
      {
        if ( dim == AF_DIMENSION_VERT )
          threshold = 64 - AF_LIGHT_MODE_MAX_HORZ_GAP / 3;
        else
          threshold = 64 - AF_LIGHT_MODE_MAX_VERT_GAP / 3;
      }
    }

    org_len    = edge2->opos - edge->opos;
    cur_len    = af_cjk_compute_stem_width( hints, dim, org_len,
                                            edge->flags,
                                            edge2->flags );

    org_center = ( edge->opos + edge2->opos ) / 2 + anchor;
    cur_pos1   = org_center - cur_len / 2;
    cur_pos2   = cur_pos1 + cur_len;
    d_off1     = cur_pos1 - FT_PIX_FLOOR( cur_pos1 );
    d_off2     = cur_pos2 - FT_PIX_FLOOR( cur_pos2 );
    u_off1     = 64 - d_off1;
    u_off2     = 64 - d_off2;
    delta      = 0;


    if ( d_off1 == 0 || d_off2 == 0 )
      goto Exit;

    if ( cur_len <= threshold )
    {
      if ( d_off2 < cur_len )
      {
        if ( u_off1 <= d_off2 )
          delta =  u_off1;
        else
          delta = -d_off2;
      }

      goto Exit;
    }

    if ( threshold < 64 )
    {
      if ( d_off1 >= threshold || u_off1 >= threshold ||
           d_off2 >= threshold || u_off2 >= threshold )
        goto Exit;
    }

    offset = cur_len & 63;

    if ( offset < 32 )
    {
      if ( u_off1 <= offset || d_off2 <= offset )
        goto Exit;
    }
    else
      offset = 64 - threshold;

    d_off1 = threshold - u_off1;
    u_off1 = u_off1    - offset;
    u_off2 = threshold - d_off2;
    d_off2 = d_off2    - offset;

    if ( d_off1 <= u_off1 )
      u_off1 = -d_off1;

    if ( d_off2 <= u_off2 )
      u_off2 = -d_off2;

    if ( FT_ABS( u_off1 ) <= FT_ABS( u_off2 ) )
      delta = u_off1;
    else
      delta = u_off2;

  Exit:

#if 1
    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) )
    {
      if ( delta > AF_LIGHT_MODE_MAX_DELTA_ABS )
        delta = AF_LIGHT_MODE_MAX_DELTA_ABS;
      else if ( delta < -AF_LIGHT_MODE_MAX_DELTA_ABS )
        delta = -AF_LIGHT_MODE_MAX_DELTA_ABS;
    }
#endif

    cur_pos1 += delta;

    if ( edge->opos < edge2->opos )
    {
      edge->pos  = cur_pos1;
      edge2->pos = cur_pos1 + cur_len;
    }
    else
    {
      edge->pos  = cur_pos1 + cur_len;
      edge2->pos = cur_pos1;
    }

    return delta;
  }